

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::assign_conv_bias_gradient(tensor *grad,tensor *gradient_input)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  float *pfVar6;
  ostream *poVar7;
  fatal_error *this;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  ostringstream dlib_o_out;
  string local_1c0;
  undefined1 local_1a0 [376];
  void *__s;
  undefined4 extraout_var_00;
  
  if ((((grad->m_n == 1) && (0 < grad->m_k)) && (grad->m_nr == 1)) &&
     (((grad->m_nc == 1 && (grad != gradient_input)) &&
      ((gradient_input->m_k == grad->m_k && (gradient_input->m_size != 0)))))) {
    iVar5 = (*grad->_vptr_tensor[3])();
    __s = (void *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*gradient_input->_vptr_tensor[2])();
    pfVar6 = (float *)CONCAT44(extraout_var_00,iVar5);
    lVar1 = gradient_input->m_k;
    if (0 < lVar1) {
      memset(__s,0,lVar1 * 4);
    }
    lVar2 = gradient_input->m_n;
    if (0 < lVar2) {
      lVar3 = gradient_input->m_nr;
      lVar8 = 0;
      do {
        if (0 < lVar1) {
          lVar4 = gradient_input->m_nc;
          lVar9 = 0;
          do {
            if (0 < lVar3) {
              lVar10 = 0;
              do {
                if (0 < lVar4) {
                  fVar12 = *(float *)((long)__s + lVar9 * 4);
                  lVar11 = lVar4;
                  do {
                    fVar12 = fVar12 + *pfVar6;
                    pfVar6 = pfVar6 + 1;
                    *(float *)((long)__s + lVar9 * 4) = fVar12;
                    lVar11 = lVar11 + -1;
                  } while (lVar11 != 0);
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != lVar3);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar1);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar2);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\n\nError detected at line ",0x19);
  poVar7 = (ostream *)std::ostream::operator<<(local_1a0,0x17f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "void dlib::cpu::assign_conv_bias_gradient(tensor &, const tensor &)",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "grad.num_samples() == 1 && grad.k() >= 1 && grad.nr() == 1 && grad.nc() == 1 && gradient_input.k() == grad.k() && gradient_input.size() > 0 && is_same_object(grad,gradient_input) == false"
             ,0xbb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".\n",2);
  *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void assign_conv_bias_gradient (
            tensor& grad,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(
                  grad.num_samples() == 1 &&
                  grad.k()  >= 1 &&
                  grad.nr() == 1 &&
                  grad.nc() == 1 &&
                  gradient_input.k() == grad.k() &&
                  gradient_input.size() > 0 && 
                  is_same_object(grad,gradient_input) == false
                  );

            auto g = grad.host();
            auto gi = gradient_input.host();

            for (long k = 0; k < gradient_input.k(); ++k)
                g[k] = 0;

            for (long n = 0; n < gradient_input.num_samples(); ++n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                            g[k] += (*gi++);
                        }
                    }
                }
            }
        }